

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

void DrawBoingBall(void)

{
  undefined8 local_28;
  double dt2;
  double dt_total;
  GLfloat lon_deg;
  
  (*glad_glPushMatrix)();
  (*glad_glMatrixMode)(0x1700);
  (*glad_glTranslatef)(0.0,0.0,147.0);
  dt2 = dt;
  while (0.0 < dt2) {
    if (dt2 <= 0.019999999552965164) {
      local_28 = dt2;
    }
    else {
      local_28 = 0.019999999552965164;
    }
    dt2 = dt2 - local_28;
    BounceBall(local_28);
    deg_rot_y = TruncateDeg(deg_rot_y_inc * (float)local_28 * 50.0 + deg_rot_y);
  }
  (*glad_glTranslatef)(ball_x,ball_y,0.0);
  if (drawBallHow == DRAW_BALL_SHADOW) {
    (*glad_glTranslatef)(-20.0,10.0,0.0);
  }
  (*glad_glRotatef)(-20.0,0.0,0.0,1.0);
  (*glad_glRotatef)(deg_rot_y,0.0,1.0,0.0);
  (*glad_glCullFace)(0x404);
  (*glad_glEnable)(0xb44);
  (*glad_glEnable)(0xba1);
  for (dt_total._4_4_ = 0.0; dt_total._4_4_ < 180.0; dt_total._4_4_ = dt_total._4_4_ + 22.5) {
    DrawBoingBallBand(dt_total._4_4_,dt_total._4_4_ + 22.5);
  }
  (*glad_glPopMatrix)();
  return;
}

Assistant:

void DrawBoingBall( void )
{
   GLfloat lon_deg;     /* degree of longitude */
   double dt_total, dt2;

   glPushMatrix();
   glMatrixMode( GL_MODELVIEW );

  /*
   * Another relative Z translation to separate objects.
   */
   glTranslatef( 0.0, 0.0, DIST_BALL );

   /* Update ball position and rotation (iterate if necessary) */
   dt_total = dt;
   while( dt_total > 0.0 )
   {
       dt2 = dt_total > MAX_DELTA_T ? MAX_DELTA_T : dt_total;
       dt_total -= dt2;
       BounceBall( dt2 );
       deg_rot_y = TruncateDeg( deg_rot_y + deg_rot_y_inc*((float)dt2*ANIMATION_SPEED) );
   }

   /* Set ball position */
   glTranslatef( ball_x, ball_y, 0.0 );

  /*
   * Offset the shadow.
   */
   if ( drawBallHow == DRAW_BALL_SHADOW )
   {
      glTranslatef( SHADOW_OFFSET_X,
                    SHADOW_OFFSET_Y,
                    SHADOW_OFFSET_Z );
   }

  /*
   * Tilt the ball.
   */
   glRotatef( -20.0, 0.0, 0.0, 1.0 );

  /*
   * Continually rotate ball around Y axis.
   */
   glRotatef( deg_rot_y, 0.0, 1.0, 0.0 );

  /*
   * Set OpenGL state for Boing ball.
   */
   glCullFace( GL_FRONT );
   glEnable( GL_CULL_FACE );
   glEnable( GL_NORMALIZE );

  /*
   * Build a faceted latitude slice of the Boing ball,
   * stepping same-sized vertical bands of the sphere.
   */
   for ( lon_deg = 0;
         lon_deg < 180;
         lon_deg += STEP_LONGITUDE )
   {
     /*
      * Draw a latitude circle at this longitude.
      */
      DrawBoingBallBand( lon_deg,
                         lon_deg + STEP_LONGITUDE );
   }

   glPopMatrix();

   return;
}